

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O3

void __thiscall BarrierTest_ArriveAndDrop_Test::TestBody(BarrierTest_ArriveAndDrop_Test *this)

{
  bool bVar1;
  barrier<yamc::detail::default_barrier_completion> barrier;
  barrier<yamc::detail::default_barrier_completion> local_90;
  
  local_90.init_count_ = 1;
  local_90.counter_ = 1;
  local_90.phase_ = 0;
  std::condition_variable::condition_variable(&local_90.cv_);
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_90.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_drop(&local_90);
  }
  std::condition_variable::~condition_variable(&local_90.cv_);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndDrop)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.arrive_and_drop());
}